

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall QList<QLayoutStruct>::QList(QList<QLayoutStruct> *this,qsizetype size)

{
  int *piVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined8 uVar7;
  QLayoutStruct *b;
  QLayoutStruct *pQVar8;
  long lVar9;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar8 = (QLayoutStruct *)QArrayData::allocate(&local_28,0x20,0x10,size,KeepSize);
  (this->d).d = (Data *)local_28;
  (this->d).ptr = pQVar8;
  (this->d).size = 0;
  if (size != 0) {
    pQVar8->spacing = 0;
    pQVar8->expansive = false;
    pQVar8->empty = false;
    pQVar8->done = false;
    pQVar8->field_0x17 = 0;
    pQVar8->pos = 0;
    pQVar8->size = 0;
    pQVar8->stretch = 0;
    pQVar8->sizeHint = 0;
    pQVar8->maximumSize = 0;
    pQVar8->minimumSize = 0;
    if (size != 1) {
      lVar9 = 0x20;
      do {
        iVar3 = pQVar8->stretch;
        iVar4 = pQVar8->sizeHint;
        iVar5 = pQVar8->maximumSize;
        iVar6 = pQVar8->minimumSize;
        uVar7 = *(undefined8 *)&pQVar8->pos;
        puVar2 = (undefined8 *)((long)&pQVar8->spacing + lVar9);
        *puVar2 = *(undefined8 *)&pQVar8->spacing;
        puVar2[1] = uVar7;
        piVar1 = (int *)((long)&pQVar8->stretch + lVar9);
        *piVar1 = iVar3;
        piVar1[1] = iVar4;
        piVar1[2] = iVar5;
        piVar1[3] = iVar6;
        lVar9 = lVar9 + 0x20;
      } while (size << 5 != lVar9);
    }
    (this->d).size = size;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit QList(qsizetype size)
        : d(size)
    {
        if (size)
            d->appendInitialize(size);
    }